

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O3

void __thiscall TypeOpStore::printRaw(TypeOpStore *this,ostream *s,PcodeOp *op)

{
  uintb uVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(s,"*(",2);
  uVar1 = ((*(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start)->loc).offset;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (s,*(char **)(uVar1 + 0x38),*(long *)(uVar1 + 0x40));
  uStack_18 = CONCAT17(0x2c,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_18 + 7),1);
  Varnode::printRaw((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                    super__Vector_impl_data._M_start[1],s);
  std::__ostream_insert<char,std::char_traits<char>>(s,") = ",4);
  Varnode::printRaw((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                    super__Vector_impl_data._M_start[2],s);
  return;
}

Assistant:

void TypeOpStore::printRaw(ostream &s,const PcodeOp *op)

{
  s << "*(";
  AddrSpace *spc = Address::getSpaceFromConst(op->getIn(0)->getAddr());
  s << spc->getName() << ',';
  op->getIn(1)->printRaw(s);
  s << ") = ";
  op->getIn(2)->printRaw(s);
}